

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O3

int32_t __thiscall
icu_63::TimeZoneFormat::parseOffsetFieldWithLocalizedDigits
          (TimeZoneFormat *this,UnicodeString *text,int32_t start,uint8_t minDigits,
          uint8_t maxDigits,uint16_t minVal,uint16_t maxVal,int32_t *parsedLen)

{
  short sVar1;
  int iVar2;
  int32_t iVar3;
  int iVar4;
  undefined7 in_register_00000009;
  uint uVar5;
  int iVar6;
  undefined3 in_register_00000081;
  undefined2 in_register_0000008a;
  int32_t start_00;
  int32_t digitLen;
  int32_t local_44;
  uint local_40;
  uint local_3c;
  TimeZoneFormat *local_38;
  
  local_40 = CONCAT22(in_register_0000008a,minVal);
  local_3c = (uint)CONCAT71(in_register_00000009,minDigits);
  uVar5 = 0;
  *parsedLen = 0;
  local_44 = 0;
  sVar1 = (text->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar2 = (text->fUnion).fFields.fLength;
  }
  else {
    iVar2 = (int)sVar1 >> 5;
  }
  start_00 = start;
  iVar6 = 0;
  if (CONCAT31(in_register_00000081,maxDigits) != 0 && start < iVar2) {
    uVar5 = 0;
    iVar6 = 0;
    local_38 = this;
    while ((iVar3 = parseSingleLocalizedDigit(local_38,text,start_00,&local_44), -1 < iVar3 &&
           (iVar2 = iVar3 + iVar6 * 10, iVar2 <= (int)(uint)maxVal))) {
      sVar1 = (text->fUnion).fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        iVar4 = (text->fUnion).fFields.fLength;
      }
      else {
        iVar4 = (int)sVar1 >> 5;
      }
      uVar5 = uVar5 + 1;
      start_00 = start_00 + local_44;
      iVar6 = iVar2;
      if ((iVar4 <= start_00) || (CONCAT31(in_register_00000081,maxDigits) <= uVar5)) break;
    }
  }
  iVar3 = -1;
  if (((local_3c & 0xff) <= uVar5) && ((int)(local_40 & 0xffff) <= iVar6)) {
    *parsedLen = start_00 - start;
    iVar3 = iVar6;
  }
  return iVar3;
}

Assistant:

int32_t
TimeZoneFormat::parseOffsetFieldWithLocalizedDigits(const UnicodeString& text, int32_t start, uint8_t minDigits, uint8_t maxDigits, uint16_t minVal, uint16_t maxVal, int32_t& parsedLen) const {
    parsedLen = 0;

    int32_t decVal = 0;
    int32_t numDigits = 0;
    int32_t idx = start;
    int32_t digitLen = 0;

    while (idx < text.length() && numDigits < maxDigits) {
        int32_t digit = parseSingleLocalizedDigit(text, idx, digitLen);
        if (digit < 0) {
            break;
        }
        int32_t tmpVal = decVal * 10 + digit;
        if (tmpVal > maxVal) {
            break;
        }
        decVal = tmpVal;
        numDigits++;
        idx += digitLen;
    }

    // Note: maxVal is checked in the while loop
    if (numDigits < minDigits || decVal < minVal) {
        decVal = -1;
        numDigits = 0;
    } else {
        parsedLen = idx - start;
    }

    return decVal;
}